

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.cpp
# Opt level: O1

void close_func(LexState *ls)

{
  int iVar1;
  FuncState *fs_00;
  lua_State *L;
  Proto *pPVar2;
  TString *pTVar3;
  ulong uVar4;
  Instruction *pIVar5;
  int *piVar6;
  TValue *pTVar7;
  Proto **ppPVar8;
  LocVar *pLVar9;
  TString **ppTVar10;
  FuncState *fs;
  
  fs_00 = ls->fs;
  L = ls->L;
  pPVar2 = fs_00->f;
  uVar4 = (ulong)fs_00->nactvar;
  if (uVar4 != 0) {
    iVar1 = fs_00->pc;
    pLVar9 = pPVar2->locvars;
    do {
      pLVar9[*(ushort *)&fs_00->upvalues[uVar4 + 0x3b].info].endpc = iVar1;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
    fs_00->nactvar = '\0';
  }
  luaK_ret(fs_00,0,0);
  if ((long)fs_00->pc < -1) {
    pIVar5 = (Instruction *)luaM_toobig(L);
  }
  else {
    pIVar5 = (Instruction *)
             luaM_realloc_(L,pPVar2->code,(long)pPVar2->sizecode << 2,(long)fs_00->pc << 2);
  }
  pPVar2->code = pIVar5;
  iVar1 = fs_00->pc;
  pPVar2->sizecode = iVar1;
  if ((long)iVar1 < -1) {
    piVar6 = (int *)luaM_toobig(L);
  }
  else {
    piVar6 = (int *)luaM_realloc_(L,pPVar2->lineinfo,(long)pPVar2->sizelineinfo << 2,
                                  (long)iVar1 << 2);
  }
  pPVar2->lineinfo = piVar6;
  pPVar2->sizelineinfo = fs_00->pc;
  if ((long)fs_00->nk < -1) {
    pTVar7 = (TValue *)luaM_toobig(L);
  }
  else {
    pTVar7 = (TValue *)luaM_realloc_(L,pPVar2->k,(long)pPVar2->sizek << 4,(long)fs_00->nk << 4);
  }
  pPVar2->k = pTVar7;
  pPVar2->sizek = fs_00->nk;
  if ((long)fs_00->np < -1) {
    ppPVar8 = (Proto **)luaM_toobig(L);
  }
  else {
    ppPVar8 = (Proto **)luaM_realloc_(L,pPVar2->p,(long)pPVar2->sizep << 3,(long)fs_00->np << 3);
  }
  pPVar2->p = ppPVar8;
  pPVar2->sizep = fs_00->np;
  if ((long)fs_00->nlocvars + 1U >> 0x3c == 0) {
    pLVar9 = (LocVar *)
             luaM_realloc_(L,pPVar2->locvars,(long)pPVar2->sizelocvars << 4,
                           (long)fs_00->nlocvars << 4);
  }
  else {
    pLVar9 = (LocVar *)luaM_toobig(L);
  }
  pPVar2->locvars = pLVar9;
  pPVar2->sizelocvars = (int)fs_00->nlocvars;
  ppTVar10 = (TString **)
             luaM_realloc_(L,pPVar2->upvalues,(long)pPVar2->sizeupvalues << 3,
                           (ulong)pPVar2->nups << 3);
  pPVar2->upvalues = ppTVar10;
  pPVar2->sizeupvalues = (uint)pPVar2->nups;
  ls->fs = fs_00->prev;
  L->top = L->top + -2;
  if ((ls->t).token - 0x11dU < 2) {
    pTVar3 = (ls->t).seminfo.ts;
    luaX_newstring(ls,(char *)(pTVar3 + 1),(pTVar3->tsv).len);
    return;
  }
  return;
}

Assistant:

static void close_func (LexState *ls) {
  lua_State *L = ls->L;
  FuncState *fs = ls->fs;
  Proto *f = fs->f;
  removevars(ls, 0);
  luaK_ret(fs, 0, 0);  /* final return */
  luaM_reallocvector(L, f->code, f->sizecode, fs->pc, Instruction);
  f->sizecode = fs->pc;
  luaM_reallocvector(L, f->lineinfo, f->sizelineinfo, fs->pc, int);
  f->sizelineinfo = fs->pc;
  luaM_reallocvector(L, f->k, f->sizek, fs->nk, TValue);
  f->sizek = fs->nk;
  luaM_reallocvector(L, f->p, f->sizep, fs->np, Proto *);
  f->sizep = fs->np;
  luaM_reallocvector(L, f->locvars, f->sizelocvars, fs->nlocvars, LocVar);
  f->sizelocvars = fs->nlocvars;
  luaM_reallocvector(L, f->upvalues, f->sizeupvalues, f->nups, TString *);
  f->sizeupvalues = f->nups;
  lua_assert(luaG_checkcode(f));
  lua_assert(fs->bl == NULL);
  ls->fs = fs->prev;
  L->top -= 2;  /* remove table and prototype from the stack */
  /* last token read was anchored in defunct function; must reanchor it */
  if (fs) anchor_token(ls);
}